

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test8::getGeneralBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test8 *this,_test_case *test_case)

{
  _variable_type type;
  string *psVar1;
  uint uVar2;
  ostream *poVar3;
  _variable_type type_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  uint uVar5;
  _variable_type *p_Var6;
  bool bVar7;
  string argument_variable_type_string;
  string variable_type_string;
  stringstream result_sstream;
  string local_200;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Utils::getVariableTypeString_abi_cxx11_(&local_1e0,(Utils *)(ulong)test_case->type,type_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," src = ",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  p_Var6 = (test_case->argument_list).
           super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = extraout_RDX;
  local_1c0 = __return_storage_ptr__;
  if (p_Var6 != (test_case->argument_list).
                super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      type = *p_Var6;
      Utils::getVariableTypeString_abi_cxx11_(&local_200,(Utils *)(ulong)type,(_variable_type)uVar4)
      ;
      uVar2 = Utils::getNumberOfComponentsForVariableType(type);
      if (p_Var6 != (test_case->argument_list).
                    super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
      uVar5 = 1;
      do {
        std::ostream::_M_insert<double>((double)(int)uVar5);
        if (uVar5 != uVar2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        }
        bVar7 = uVar5 != uVar2;
        uVar5 = uVar5 + 1;
      } while (bVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      uVar4 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        uVar4 = extraout_RDX_01;
      }
      p_Var6 = p_Var6 + 1;
    } while (p_Var6 != (test_case->argument_list).
                       super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

std::string GPUShaderFP64Test8::getGeneralBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form the body */
	std::string variable_type_string = Utils::getVariableTypeString(test_case.type);

	result_sstream << variable_type_string << " src = " << variable_type_string << "(";

	for (_argument_list_const_iterator argument_list_iterator = test_case.argument_list.begin();
		 argument_list_iterator != test_case.argument_list.end(); argument_list_iterator++)
	{
		const Utils::_variable_type argument_variable_type = *argument_list_iterator;
		std::string		   argument_variable_type_string   = Utils::getVariableTypeString(argument_variable_type);
		const unsigned int argument_n_components = Utils::getNumberOfComponentsForVariableType(argument_variable_type);

		if (argument_list_iterator != test_case.argument_list.begin())
		{
			result_sstream << ", ";
		}

		result_sstream << argument_variable_type_string << "(";

		for (unsigned int n_component = 0; n_component < argument_n_components; ++n_component)
		{
			result_sstream << (double)(n_component + 1);

			if (n_component != (argument_n_components - 1))
			{
				result_sstream << ", ";
			}
		} /* for (all argument components) */

		result_sstream << ")";
	} /* for (all arguments) */

	result_sstream << ");\n";

	return result_sstream.str();
}